

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_10ab78d::AV1CompAvgPredTest::SetUp(AV1CompAvgPredTest *this)

{
  bool bVar1;
  uint8_t uVar2;
  char *expr1;
  void *pvVar3;
  char *in_RDI;
  int i_1;
  int i;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined8 in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  uchar **in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  int local_c8;
  Type in_stack_ffffffffffffff3c;
  int iVar4;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a8 [2];
  undefined8 local_88;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  AssertionResult local_18;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  expr1 = in_RDI + 0x18;
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff10,iVar4);
  pvVar3 = aom_memalign((size_t)expr1,(size_t)in_stack_ffffffffffffff20);
  *(void **)(in_RDI + 0x20) = pvVar3;
  local_20 = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (expr1,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             &in_stack_ffffffffffffff10->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0xaaef75);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,
               (int)((ulong)expr1 >> 0x20),in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0xaaefd2);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaaf059);
  if (local_44 == 0) {
    pvVar3 = aom_memalign((size_t)expr1,(size_t)in_stack_ffffffffffffff20);
    *(void **)(in_RDI + 0x28) = pvVar3;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (expr1,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               &in_stack_ffffffffffffff10->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff18 =
           (uchar **)testing::AssertionResult::failure_message((AssertionResult *)0xaaf0fc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,
                 (int)((ulong)expr1 >> 0x20),in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
      testing::Message::~Message((Message *)0xaaf159);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xaaf1e0);
    if (local_44 == 0) {
      pvVar3 = aom_memalign((size_t)expr1,(size_t)in_stack_ffffffffffffff20);
      *(void **)(in_RDI + 0x30) = pvVar3;
      local_88 = 0;
      testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                (expr1,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 &in_stack_ffffffffffffff10->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff10 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xaaf271);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,
                   (int)((ulong)expr1 >> 0x20),in_stack_ffffffffffffff20);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
        testing::Message::~Message((Message *)0xaaf2bf);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xaaf33a);
      if (local_44 == 0) {
        pvVar3 = aom_memalign((size_t)expr1,(size_t)in_stack_ffffffffffffff20);
        *(void **)(in_RDI + 0x38) = pvVar3;
        testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                  (expr1,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   &in_stack_ffffffffffffff10->data_);
        iVar4 = (int)((ulong)expr1 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff40);
          testing::AssertionResult::failure_message((AssertionResult *)0xaaf3c8);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,iVar4,
                     in_stack_ffffffffffffff20);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
          testing::Message::~Message((Message *)0xaaf414);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xaaf48f);
        if (local_44 == 0) {
          for (iVar4 = 0; iVar4 < 0x4000; iVar4 = iVar4 + 1) {
            uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_ffffffffffffff10);
            *(uint8_t *)(*(long *)(in_RDI + 0x30) + (long)iVar4) = uVar2;
          }
          for (local_c8 = 0; local_c8 < 0x4000; local_c8 = local_c8 + 1) {
            uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_ffffffffffffff10);
            *(uint8_t *)(*(long *)(in_RDI + 0x38) + (long)local_c8) = uVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AV1CompAvgPredTest::SetUp() {
  rnd_.Reset(libaom_test::ACMRandom::DeterministicSeed());

  comp_pred1_ = (uint8_t *)aom_memalign(16, MAX_SB_SQUARE);
  ASSERT_NE(comp_pred1_, nullptr);
  comp_pred2_ = (uint8_t *)aom_memalign(16, MAX_SB_SQUARE);
  ASSERT_NE(comp_pred2_, nullptr);
  pred_ = (uint8_t *)aom_memalign(16, MAX_SB_SQUARE);
  ASSERT_NE(pred_, nullptr);
  ref_ = (uint8_t *)aom_memalign(16, MAX_SB_SQUARE);
  ASSERT_NE(ref_, nullptr);
  for (int i = 0; i < MAX_SB_SQUARE; ++i) {
    pred_[i] = rnd_.Rand8();
  }
  for (int i = 0; i < MAX_SB_SQUARE; ++i) {
    ref_[i] = rnd_.Rand8();
  }
}